

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O3

bool __thiscall Js::PathTypeHandlerBase::HasSingletonInstance(PathTypeHandlerBase *this)

{
  TypePath *pTVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  bVar3 = DynamicTypeHandler::ShouldFixAnyProperties();
  if ((!bVar3) &&
     ((((this->typePath).ptr)->singletonInstance).ptr !=
      (RecyclerWeakReference<Js::DynamicObject> *)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xbe1,"(HasSingletonInstanceOnlyIfNeeded())",
                                "HasSingletonInstanceOnlyIfNeeded()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  if ((DAT_015bf361 == '\x01') &&
     (pTVar1 = (this->typePath).ptr,
     (pTVar1->singletonInstance).ptr != (RecyclerWeakReference<Js::DynamicObject> *)0x0)) {
    bVar3 = (ushort)((pTVar1->data).ptr)->maxInitializedLength <=
            (this->super_DynamicTypeHandler).unusedBytes >> 1;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool PathTypeHandlerBase::HasSingletonInstance() const
    {
        Assert(HasSingletonInstanceOnlyIfNeeded());
        if (!FixPropsOnPathTypes())
        {
            return false;
        }

        return this->GetTypePath()->HasSingletonInstance() && GetPathLength() >= this->GetTypePath()->GetMaxInitializedLength();
    }